

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

void Super_WriteLibraryGateName_rec(Super_Gate_t_conflict *pGate,char *pBuffer)

{
  char *__src;
  int local_28;
  char local_22 [2];
  int i;
  char Buffer [10];
  char *pBuffer_local;
  Super_Gate_t_conflict *pGate_local;
  
  Buffer._2_8_ = pBuffer;
  if (pGate->pRoot == (Mio_Gate_t *)0x0) {
    sprintf(local_22,"%c",(ulong)((*(uint *)&pGate->field_0x8 >> 8) + 0x61));
    strcat((char *)Buffer._2_8_,local_22);
  }
  else {
    __src = Mio_GateReadName(pGate->pRoot);
    strcat(pBuffer,__src);
    strcat((char *)Buffer._2_8_,"(");
    for (local_28 = 0; local_28 < (int)(*(uint *)&pGate->field_0x8 >> 2 & 0x3f);
        local_28 = local_28 + 1) {
      if (local_28 != 0) {
        strcat((char *)Buffer._2_8_,",");
      }
      Super_WriteLibraryGateName_rec(pGate->pFanins[local_28],(char *)Buffer._2_8_);
    }
    strcat((char *)Buffer._2_8_,")");
  }
  return;
}

Assistant:

void Super_WriteLibraryGateName_rec( Super_Gate_t * pGate, char * pBuffer )
{
    char Buffer[10];
    int i;

    if ( pGate->pRoot == NULL )
    {
        sprintf( Buffer, "%c", 'a' + pGate->Number );
        strcat( pBuffer, Buffer );
        return;
    }
    strcat( pBuffer, Mio_GateReadName(pGate->pRoot) );
    strcat( pBuffer, "(" );
    for ( i = 0; i < (int)pGate->nFanins; i++ )
    {
        if ( i )
            strcat( pBuffer, "," );
        Super_WriteLibraryGateName_rec( pGate->pFanins[i], pBuffer );
    }
    strcat( pBuffer, ")" );
}